

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_impl.h
# Opt level: O2

State __thiscall
packet::PacketT<packet::DefaultConfig>::nextState(PacketT<packet::DefaultConfig> *this)

{
  State SVar1;
  
  SVar1 = NONE;
  if (this->reading_state_ < NONE) {
    SVar1 = this->reading_state_ + DATA_SIZE;
  }
  return SVar1;
}

Assistant:

inline typename PacketT<Cfg>::State
PacketT<Cfg>::nextState(void) const
{
  switch (reading_state_) {
    case State::HEAD_PATTERN: return State::DATA_SIZE;
    case State::DATA_SIZE: return State::DATA;
    case State::DATA: return (TAIL_PATTERN_SIZE > 0 ? State::TAIL_PATTERN : State::NONE);
    case State::TAIL_PATTERN: return State::NONE;
    default:
      PKT_ASSERT(false && "invalid state");
  }
  return State::NONE;
}